

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

int Kf_SetMergeOrderOne(Kf_Cut_t *pCut0,Kf_Cut_t *pCut1,Kf_Cut_t *pCut,int nLutSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_5c;
  int local_58;
  int c;
  int k;
  int i;
  int *pC;
  int *pC1;
  int *pC0;
  int nSize1;
  int nSize0;
  int nLutSize_local;
  Kf_Cut_t *pCut_local;
  Kf_Cut_t *pCut1_local;
  Kf_Cut_t *pCut0_local;
  
  iVar1 = pCut0->nLeaves;
  iVar2 = pCut1->nLeaves;
  if ((iVar1 == nLutSize) && (iVar2 == nLutSize)) {
    for (c = 0; c < iVar1; c = c + 1) {
      if (pCut0->pLeaves[c] != pCut1->pLeaves[c]) {
        return 0;
      }
      pCut->pLeaves[c] = pCut0->pLeaves[c];
    }
    pCut->nLeaves = nLutSize;
    pCut0_local._4_4_ = 1;
  }
  else {
    local_58 = 0;
    c = 0;
    for (local_5c = 0; local_5c != nLutSize; local_5c = local_5c + 1) {
      if (pCut0->pLeaves[c] < pCut1->pLeaves[local_58]) {
        iVar4 = c + 1;
        pCut->pLeaves[local_5c] = pCut0->pLeaves[c];
        iVar3 = local_58;
        c = iVar4;
        if (iVar1 <= iVar4) {
LAB_0097ec45:
          local_58 = iVar3;
          local_5c = local_5c + 1;
          if (nLutSize + local_58 < local_5c + iVar2) {
            return 0;
          }
          while (local_58 < iVar2) {
            pCut->pLeaves[local_5c] = pCut1->pLeaves[local_58];
            local_5c = local_5c + 1;
            local_58 = local_58 + 1;
          }
          pCut->nLeaves = local_5c;
          return 1;
        }
      }
      else {
        if (pCut1->pLeaves[local_58] < pCut0->pLeaves[c]) {
          pCut->pLeaves[local_5c] = pCut1->pLeaves[local_58];
        }
        else {
          iVar4 = c + 1;
          pCut->pLeaves[local_5c] = pCut0->pLeaves[c];
          iVar3 = local_58 + 1;
          c = iVar4;
          if (iVar1 <= iVar4) goto LAB_0097ec45;
        }
        if (iVar2 <= local_58 + 1) {
          local_5c = local_5c + 1;
          if (nLutSize + c < local_5c + iVar1) {
            return 0;
          }
          while (c < iVar1) {
            pCut->pLeaves[local_5c] = pCut0->pLeaves[c];
            local_5c = local_5c + 1;
            c = c + 1;
          }
          pCut->nLeaves = local_5c;
          return 1;
        }
        local_58 = local_58 + 1;
      }
    }
    pCut0_local._4_4_ = 0;
  }
  return pCut0_local._4_4_;
}

Assistant:

static inline int Kf_SetMergeOrderOne( Kf_Cut_t * pCut0, Kf_Cut_t * pCut1, Kf_Cut_t * pCut, int nLutSize )
{ 
    int nSize0 = pCut0->nLeaves;
    int nSize1 = pCut1->nLeaves;
    int * pC0 = pCut0->pLeaves;
    int * pC1 = pCut1->pLeaves;
    int * pC = pCut->pLeaves;
    int i, k, c;
    // the case of the largest cut sizes
    if ( nSize0 == nLutSize && nSize1 == nLutSize )
    {
        for ( i = 0; i < nSize0; i++ )
        {
            if ( pC0[i] != pC1[i] )  return 0;
            pC[i] = pC0[i];
        }
        pCut->nLeaves = nLutSize;
        return 1;
    }
    // compare two cuts with different numbers
    i = k = c = 0;
    while ( 1 )
    {
        if ( c == nLutSize ) return 0;
        if ( pC0[i] < pC1[k] )
        {
            pC[c++] = pC0[i++];
            if ( i >= nSize0 ) goto FlushCut1;
        }
        else if ( pC0[i] > pC1[k] )
        {
            pC[c++] = pC1[k++];
            if ( k >= nSize1 ) goto FlushCut0;
        }
        else
        {
            pC[c++] = pC0[i++]; k++;
            if ( i >= nSize0 ) goto FlushCut1;
            if ( k >= nSize1 ) goto FlushCut0;
        }
    }

FlushCut0:
    if ( c + nSize0 > nLutSize + i ) return 0;
    while ( i < nSize0 )
        pC[c++] = pC0[i++];
    pCut->nLeaves = c;
    return 1;

FlushCut1:
    if ( c + nSize1 > nLutSize + k ) return 0;
    while ( k < nSize1 )
        pC[c++] = pC1[k++];
    pCut->nLeaves = c;
    return 1;
}